

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

void __thiscall rtosc::UndoHistory::recordEvent(UndoHistory *this,char *msg)

{
  long *plVar1;
  ulong __new_size;
  UndoHistoryImpl *this_00;
  bool bVar2;
  size_type sVar3;
  size_t N;
  char *buf;
  time_t now;
  reference ppVar4;
  pair<long,_const_char_*> local_38;
  
  sVar3 = std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
          ::size(&this->impl->history);
  __new_size = this->impl->history_pos;
  if (sVar3 != (__new_size & 0xffffffff)) {
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    resize(&this->impl->history,__new_size);
  }
  N = rtosc_message_length(msg,0xffffffffffffffff);
  buf = (char *)operator_new__(N);
  now = time((time_t *)0x0);
  bVar2 = UndoHistoryImpl::mergeEvent(this->impl,now,msg,buf,N);
  if (!bVar2) {
    memcpy(buf,msg,N);
    local_38.first = now;
    local_38.second = buf;
    std::deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>>::
    emplace_back<std::pair<long,char_const*>>
              ((deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>> *)
               this->impl,&local_38);
    this_00 = this->impl;
    plVar1 = &this_00->history_pos;
    *plVar1 = *plVar1 + 1;
    sVar3 = std::
            deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
            size(&this_00->history);
    if (this->impl->max_history_size < sVar3) {
      ppVar4 = std::
               _Deque_iterator<std::pair<long,_const_char_*>,_std::pair<long,_const_char_*>_&,_std::pair<long,_const_char_*>_*>
               ::operator[](&(this->impl->history).
                             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                             ._M_impl.super__Deque_impl_data._M_start,0);
      if (ppVar4->second != (char *)0x0) {
        operator_delete__(ppVar4->second);
      }
      std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
      pop_front(&this->impl->history);
      plVar1 = &this->impl->history_pos;
      *plVar1 = *plVar1 + -1;
    }
  }
  return;
}

Assistant:

void UndoHistory::recordEvent(const char *msg)
{
    //TODO Properly account for when you have traveled back in time.
    //while this could result in another branch of history, the simple method
    //would be to kill off any future redos when new history is recorded
    if(impl->history.size() != (unsigned) impl->history_pos) {
        impl->history.resize(impl->history_pos);
    }

    size_t len = rtosc_message_length(msg, -1);
    char *data = new char[len];
    time_t now = time(NULL);
    //printf("now = '%ld'\n", now);
    if(!impl->mergeEvent(now, msg, data, len)) {
        memcpy(data, msg, len);
        impl->history.push_back(make_pair(now, data));
        impl->history_pos++;
        if(impl->history.size() > impl->max_history_size)
        {
            delete[] impl->history[0].second;
            impl->history.pop_front();
            impl->history_pos--;
        }
    }

}